

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O3

SMDiagnostic * __thiscall
llvm::SourceMgr::GetMessage
          (SMDiagnostic *__return_storage_ptr__,SourceMgr *this,SMLoc Loc,DiagKind Kind,Twine *Msg,
          ArrayRef<llvm::SMRange> Ranges,ArrayRef<llvm::SMFixIt> FixIts)

{
  char *pcVar1;
  int iVar2;
  StringRef Msg_00;
  StringRef LineStr_00;
  ArrayRef<std::pair<unsigned_int,_unsigned_int>_> Ranges_00;
  StringRef FN;
  uint i;
  int iVar3;
  MemoryBuffer *pMVar4;
  undefined4 extraout_var;
  pair<unsigned_int,_unsigned_int> pVar5;
  size_t extraout_RDX;
  ulong uVar6;
  SMLoc *pSVar7;
  char *pcVar8;
  int iVar9;
  char *pcVar10;
  SMLoc SVar11;
  SMLoc SVar12;
  string LineStr;
  SmallVector<std::pair<unsigned_int,_unsigned_int>,_4U> ColRanges;
  char *local_100;
  size_t local_f8;
  string local_e8;
  SourceMgr *local_c8;
  SMDiagnostic *local_c0;
  Twine *local_b8;
  pair<unsigned_int,_unsigned_int> *local_b0;
  ulong uStack_a8;
  char *local_a0;
  size_t sStack_98;
  char local_90;
  undefined7 uStack_8f;
  char *local_80;
  size_t sStack_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  size_t sStack_68;
  SmallVectorTemplateBase<std::pair<unsigned_int,_unsigned_int>,_true> local_60;
  pair<unsigned_int,_unsigned_int> local_50 [4];
  
  local_60.super_SmallVectorTemplateCommon<std::pair<unsigned_int,_unsigned_int>,_void>.
  super_SmallVectorBase.BeginX = local_50;
  local_60.super_SmallVectorTemplateCommon<std::pair<unsigned_int,_unsigned_int>,_void>.
  super_SmallVectorBase.Size = 0;
  local_60.super_SmallVectorTemplateCommon<std::pair<unsigned_int,_unsigned_int>,_void>.
  super_SmallVectorBase.Capacity = 4;
  local_a0 = &local_90;
  sStack_98 = 0;
  local_90 = '\0';
  if (Loc.Ptr == (char *)0x0) {
    iVar3 = -1;
    pVar5.first = 0;
    pVar5.second = 0;
    local_f8 = 9;
    local_100 = "<unknown>";
  }
  else {
    local_b8 = Msg;
    i = FindBufferContainingLoc(this,Loc);
    if (i == 0) {
      __assert_fail("CurBuf && \"Invalid or unspecified location!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SourceMgr.cpp"
                    ,0xb5,
                    "SMDiagnostic llvm::SourceMgr::GetMessage(SMLoc, SourceMgr::DiagKind, const Twine &, ArrayRef<SMRange>, ArrayRef<SMFixIt>) const"
                   );
    }
    local_c8 = this;
    pMVar4 = getMemoryBuffer(this,i);
    iVar3 = (*pMVar4->_vptr_MemoryBuffer[2])(pMVar4);
    local_100 = (char *)CONCAT44(extraout_var,iVar3);
    SVar12.Ptr = Loc.Ptr;
    while (pcVar8 = SVar12.Ptr, pcVar10 = pMVar4->BufferStart, pcVar8 != pMVar4->BufferStart) {
      pcVar10 = pcVar8;
      if ((pcVar8[-1] == '\r') || (SVar12.Ptr = pcVar8 + -1, pcVar8[-1] == '\n')) break;
    }
    pcVar8 = pMVar4->BufferEnd;
    SVar12.Ptr = Loc.Ptr;
    SVar11.Ptr = Loc.Ptr;
    if (pcVar8 != Loc.Ptr) {
      do {
        SVar12.Ptr = SVar11.Ptr;
        if ((*SVar11.Ptr == '\n') || (*SVar11.Ptr == '\r')) break;
        SVar11.Ptr = SVar11.Ptr + 1;
        SVar12.Ptr = pcVar8;
      } while (SVar11.Ptr != pcVar8);
    }
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    local_c0 = __return_storage_ptr__;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,pcVar10,SVar12.Ptr);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((int)Ranges.Length != 0) {
      pSVar7 = &(Ranges.Data)->End;
      uVar6 = 0;
      do {
        if (Ranges.Length <= uVar6) {
          __assert_fail("Index < Length && \"Invalid index!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/ArrayRef.h"
                        ,0xf1,
                        "const T &llvm::ArrayRef<llvm::SMRange>::operator[](size_t) const [T = llvm::SMRange]"
                       );
        }
        pcVar8 = (((SMRange *)(pSVar7 + -1))->Start).Ptr;
        if (((pcVar8 != (char *)0x0) && (pcVar8 <= SVar12.Ptr)) &&
           (pcVar1 = pSVar7->Ptr, pcVar10 <= pcVar1)) {
          iVar9 = (int)pcVar10;
          iVar3 = (int)pcVar8;
          if (pcVar8 < pcVar10) {
            iVar3 = iVar9;
          }
          iVar2 = (int)pcVar1;
          if (SVar12.Ptr < pcVar1) {
            iVar2 = (int)SVar12.Ptr;
          }
          local_e8._M_dataplus._M_p._4_4_ = iVar2 - iVar9;
          local_e8._M_dataplus._M_p._0_4_ = iVar3 - iVar9;
          SmallVectorTemplateBase<std::pair<unsigned_int,_unsigned_int>,_true>::push_back
                    (&local_60,(pair<unsigned_int,_unsigned_int> *)&local_e8);
        }
        uVar6 = uVar6 + 1;
        pSVar7 = pSVar7 + 2;
      } while ((int)Ranges.Length != (int)uVar6);
    }
    this = local_c8;
    pVar5 = getLineAndColumn(local_c8,Loc,i);
    iVar3 = pVar5.second - 1;
    Msg = local_b8;
    __return_storage_ptr__ = local_c0;
    local_f8 = extraout_RDX;
  }
  Twine::str_abi_cxx11_(&local_e8,Msg);
  local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_e8._M_dataplus._M_p;
  sStack_68 = local_e8._M_string_length;
  local_80 = local_a0;
  sStack_78 = sStack_98;
  local_b0 = (pair<unsigned_int,_unsigned_int> *)
             local_60.super_SmallVectorTemplateCommon<std::pair<unsigned_int,_unsigned_int>,_void>.
             super_SmallVectorBase.BeginX;
  uStack_a8 = local_60.super_SmallVectorTemplateCommon<std::pair<unsigned_int,_unsigned_int>,_void>.
              super_SmallVectorBase._8_8_ & 0xffffffff;
  FN.Length = local_f8;
  FN.Data = local_100;
  Msg_00.Length = local_e8._M_string_length;
  Msg_00.Data = local_e8._M_dataplus._M_p;
  LineStr_00.Length = sStack_98;
  LineStr_00.Data = local_a0;
  Ranges_00.Length = uStack_a8;
  Ranges_00.Data =
       (pair<unsigned_int,_unsigned_int> *)
       local_60.super_SmallVectorTemplateCommon<std::pair<unsigned_int,_unsigned_int>,_void>.
       super_SmallVectorBase.BeginX;
  SMDiagnostic::SMDiagnostic
            (__return_storage_ptr__,this,Loc,FN,pVar5.first,iVar3,Kind,Msg_00,LineStr_00,Ranges_00,
             FixIts);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  if ((pair<unsigned_int,_unsigned_int> *)
      local_60.super_SmallVectorTemplateCommon<std::pair<unsigned_int,_unsigned_int>,_void>.
      super_SmallVectorBase.BeginX != local_50) {
    free(local_60.super_SmallVectorTemplateCommon<std::pair<unsigned_int,_unsigned_int>,_void>.
         super_SmallVectorBase.BeginX);
  }
  return __return_storage_ptr__;
}

Assistant:

SMDiagnostic SourceMgr::GetMessage(SMLoc Loc, SourceMgr::DiagKind Kind,
                                   const Twine &Msg,
                                   ArrayRef<SMRange> Ranges,
                                   ArrayRef<SMFixIt> FixIts) const {
  // First thing to do: find the current buffer containing the specified
  // location to pull out the source line.
  SmallVector<std::pair<unsigned, unsigned>, 4> ColRanges;
  std::pair<unsigned, unsigned> LineAndCol;
  StringRef BufferID = "<unknown>";
  std::string LineStr;

  if (Loc.isValid()) {
    unsigned CurBuf = FindBufferContainingLoc(Loc);
    assert(CurBuf && "Invalid or unspecified location!");

    const MemoryBuffer *CurMB = getMemoryBuffer(CurBuf);
    BufferID = CurMB->getBufferIdentifier();

    // Scan backward to find the start of the line.
    const char *LineStart = Loc.getPointer();
    const char *BufStart = CurMB->getBufferStart();
    while (LineStart != BufStart && LineStart[-1] != '\n' &&
           LineStart[-1] != '\r')
      --LineStart;

    // Get the end of the line.
    const char *LineEnd = Loc.getPointer();
    const char *BufEnd = CurMB->getBufferEnd();
    while (LineEnd != BufEnd && LineEnd[0] != '\n' && LineEnd[0] != '\r')
      ++LineEnd;
    LineStr = std::string(LineStart, LineEnd);

    // Convert any ranges to column ranges that only intersect the line of the
    // location.
    for (unsigned i = 0, e = Ranges.size(); i != e; ++i) {
      SMRange R = Ranges[i];
      if (!R.isValid()) continue;

      // If the line doesn't contain any part of the range, then ignore it.
      if (R.Start.getPointer() > LineEnd || R.End.getPointer() < LineStart)
        continue;

      // Ignore pieces of the range that go onto other lines.
      if (R.Start.getPointer() < LineStart)
        R.Start = SMLoc::getFromPointer(LineStart);
      if (R.End.getPointer() > LineEnd)
        R.End = SMLoc::getFromPointer(LineEnd);

      // Translate from SMLoc ranges to column ranges.
      // FIXME: Handle multibyte characters.
      ColRanges.push_back(std::make_pair(R.Start.getPointer()-LineStart,
                                         R.End.getPointer()-LineStart));
    }

    LineAndCol = getLineAndColumn(Loc, CurBuf);
  }

  return SMDiagnostic(*this, Loc, BufferID, LineAndCol.first,
                      LineAndCol.second-1, Kind, Msg.str(),
                      LineStr, ColRanges, FixIts);
}